

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crange.h
# Opt level: O0

complex<double> CRange::lngamma<double>(complex<double> *z)

{
  undefined8 extraout_RAX;
  undefined8 extraout_RDX;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  complex<double> cVar9;
  double local_f8;
  complex<double> local_f0;
  complex<double> local_e0;
  complex<double> local_d0;
  complex<double> local_c0 [2];
  undefined1 local_a0 [8];
  complex<double> lpi;
  double lterm3;
  double aterm3;
  double cterm;
  double fj;
  double dStack_68;
  int j;
  double denom;
  double num;
  double lterm2;
  double lterm1;
  double aterm2;
  double aterm1;
  double r;
  double y;
  double x;
  complex<double> *z_local;
  complex<double> result;
  undefined8 uVar1;
  
  dVar2 = std::complex<double>::real_abi_cxx11_(z);
  if (dVar2 <= 0.0) {
    dVar2 = std::complex<double>::real_abi_cxx11_(z);
    y = -dVar2;
    dVar2 = std::complex<double>::imag_abi_cxx11_(z);
    r = -dVar2;
  }
  else {
    dVar2 = std::complex<double>::real_abi_cxx11_(z);
    y = dVar2 - 1.0;
    r = std::complex<double>::imag_abi_cxx11_(z);
  }
  dVar2 = sqrt((y + 5.5) * (y + 5.5) + r * r);
  dVar3 = log(dVar2);
  dVar4 = atan2(r,y + 5.5);
  dVar2 = log(dVar2);
  dVar5 = atan2(r,y + 5.5);
  dVar6 = log(6.283185307179586);
  denom = 0.0;
  dStack_68 = 1.000000000190015;
  for (fj._4_4_ = 1; fj._4_4_ < 7; fj._4_4_ = fj._4_4_ + 1) {
    dVar7 = (double)fj._4_4_;
    dVar8 = lngamma<double>::coeff[fj._4_4_ + -1] / ((y + dVar7) * (y + dVar7) + r * r);
    denom = dVar8 + denom;
    dStack_68 = (y + dVar7) * dVar8 + dStack_68;
  }
  dVar7 = -r * denom;
  dVar8 = atan2(dVar7,dStack_68);
  dVar7 = log(dVar7 * dVar7 + dStack_68 * dStack_68);
  lpi._M_value._8_8_ = dVar7 * 0.5;
  std::complex<double>::complex
            ((complex<double> *)&z_local,
             (y + 0.5) * dVar2 + dVar6 * 0.5 + -r * dVar5 + -(y + 5.5) + (double)lpi._M_value._8_8_,
             r * dVar3 + (y + 0.5) * dVar4 + -r + dVar8);
  dVar2 = std::complex<double>::real_abi_cxx11_(z);
  local_c0[0]._M_value._8_8_ = extraout_RAX;
  uVar1 = extraout_RDX;
  if (dVar2 < 0.0) {
    dVar2 = log(3.141592653589793);
    local_c0[0]._M_value._8_8_ = 0;
    std::complex<double>::complex((complex<double> *)local_a0,dVar2,0.0);
    local_f8 = 3.141592653589793;
    std::operator*(&local_f8,z);
    local_f0._M_value._8_8_ = local_c0[0]._M_value._8_8_;
    std::sin<double>(&local_f0);
    local_e0._M_value._8_8_ = local_c0[0]._M_value._8_8_;
    std::log<double>(&local_e0);
    local_d0._M_value._8_8_ = local_c0[0]._M_value._8_8_;
    std::operator+((complex<double> *)&z_local,&local_d0);
    cVar9 = std::operator-((complex<double> *)local_a0,local_c0);
    uVar1 = cVar9._M_value._8_8_;
  }
  cVar9._M_value._8_8_ = uVar1;
  cVar9._M_value._0_8_ = local_c0[0]._M_value._8_8_;
  return (complex<double>)cVar9._M_value;
}

Assistant:

std::complex<T> lngamma( const std::complex<T> &z )
    {
        const static T coeff[6] = {76.18009172947146,
            -86.50532032941677,
            24.01409824083091,
            -1.231739572450155,
            0.1208650973866179e-2,
            -0.5395239384953e-5};
        T x, y;
        if(z.real() > 0) {
            x=z.real()-1.0;
            y=z.imag();
        } else {
            x=-z.real();
            y=-z.imag();
        }
        T r = sqrt((x+5.5)*(x+5.5)+y*y);
        T aterm1=y*log(r);
        T aterm2=(x+0.5)*atan2(y,(x+5.5))-y;
        T lterm1=(x+0.5)*log(r);
        T lterm2=-y*atan2(y,(x+5.5)) - (x+5.5) + 0.5*log(2.0*M_PI);
        T num=0.0;
        T denom=1.000000000190015;
        for(int j=1;j<7;j++){
            T fj=(T)j;
            T cterm=coeff[j-1]/((x+fj)*(x+fj)+y*y);
            num+=cterm;
            denom+=(x+fj)*cterm;
        }
        num*=-y;
        T aterm3=atan2(num,denom);
        T lterm3 = 0.5*log(num*num + denom*denom);
        std::complex<T> result(lterm1+lterm2+lterm3,aterm1+aterm2+aterm3);
        if(z.real() < 0){
            std::complex<T> lpi(log(M_PI), 0.0);
            result = lpi - (result + std::log(std::sin(M_PI*z)));
        }
        return(result);
    }